

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O1

void __thiscall TemporalPhaseDecodingSynapse::update(TemporalPhaseDecodingSynapse *this)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  Event *pEVar4;
  Population *pPVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  int iVar17;
  double dVar14;
  _func_int **pp_Var15;
  undefined1 auVar16 [16];
  double dVar18;
  undefined1 auVar19 [16];
  int iVar20;
  
  if (0 < this->inputSize) {
    uVar12 = 0;
    do {
      dVar14 = this->currentWindow;
      dVar18 = this->param->window_length_s;
      dVar13 = Clock::getCurrentTime(this->clock);
      auVar8 = _DAT_0010d050;
      auVar7 = _DAT_0010d040;
      if (dVar14 + dVar18 <= dVar13) {
        uVar1 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar1 < 0) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        pdVar2 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        if (1 < (long)uVar1) {
          uVar10 = 0;
          do {
            pdVar2[uVar10] = -1.0;
            (pdVar2 + uVar10)[1] = -1.0;
            uVar10 = uVar10 + 2;
          } while (uVar10 < (uVar1 & 0x7ffffffffffffffe));
        }
        if ((long)(uVar1 & 0x7ffffffffffffffe) < (long)uVar1) {
          uVar9 = (uint)uVar1 & 1;
          lVar11 = (ulong)uVar9 - 1;
          auVar16._8_4_ = (int)lVar11;
          auVar16._0_8_ = lVar11;
          auVar16._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar16 = auVar16 ^ auVar8;
          uVar10 = 0;
          do {
            auVar19._8_4_ = (int)uVar10;
            auVar19._0_8_ = uVar10;
            auVar19._12_4_ = (int)(uVar10 >> 0x20);
            auVar19 = (auVar19 | auVar7) ^ auVar8;
            bVar6 = auVar16._0_4_ < auVar19._0_4_;
            iVar17 = auVar16._4_4_;
            iVar20 = auVar19._4_4_;
            if ((bool)(~(iVar17 < iVar20 || iVar20 == iVar17 && bVar6) & 1)) {
              pdVar2[(uVar1 & 0xfffffffffffffffe) + uVar10] = -1.0;
            }
            if (iVar17 >= iVar20 && (iVar20 != iVar17 || !bVar6)) {
              pdVar2[(uVar1 & 0xfffffffffffffffe) + uVar10 + 1] = -1.0;
            }
            uVar10 = uVar10 + 2;
          } while ((uVar9 + 1 & 0xfffffffe) != uVar10);
        }
        this->currentWindow = this->param->window_length_s + this->currentWindow;
      }
      if (0 < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows) {
        lVar11 = 0;
        do {
          pdVar3 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          pdVar2 = pdVar3 + lVar11;
          if ((*pdVar2 <= 0.0 && *pdVar2 != 0.0) &&
             (pEVar4 = (((this->super_Synapse).from_population)->output).
                       super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12], pEVar4->type == Spike)) {
            dVar18 = (double)this->param->som_frequency;
            dVar14 = round((((pEVar4->eventTime - this->currentWindow) - this->phaseOffset) /
                           this->param->window_length_s) * dVar18);
            pp_Var15 = (_func_int **)((dVar14 / dVar18 + -0.1) * 1.25);
            pdVar3[lVar11] = (double)pp_Var15;
            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12][1]._vptr_Event = pp_Var15;
          }
          pPVar5 = (this->super_Synapse).to_population;
          (*pPVar5->_vptr_Population[5])
                    (pPVar5,uVar12 & 0xffffffff,
                     (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12]);
          lVar11 = lVar11 + 1;
        } while (lVar11 < (this->spikeTimes).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows);
      }
      Logging::logValue(this->logger,(long)this,(int)uVar12,3,
                        (double)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar12][1]._vptr_Event);
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)this->inputSize);
  }
  return;
}

Assistant:

void TemporalPhaseDecodingSynapse::update() {
    for(int i = 0; i < inputSize; i++) {
        if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
            spikeTimes.setConstant(-1);
            currentWindow += param->window_length_s;
        }
        for(int j = 0; j < spikeTimes.size(); j++) {
            if(spikeTimes(j) < 0 && from_population->output[i]->type == EventType::Spike) {
                
                double s0 = from_population->output[i]->eventTime - currentWindow - phaseOffset;
                s0 = round(s0/param->window_length_s*param->som_frequency);
                spikeTimes(j) = s0 * 1 / (param->som_frequency);
                spikeTimes(j) = (spikeTimes(j) - 0.1) * 1.25;

                static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(j));
            } 
            to_population->setInput(i, output[i]);
        }
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}